

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2Comment(void *ctx,xmlChar *value)

{
  xmlNodePtr node;
  
  if (ctx == (void *)0x0) {
    return;
  }
  node = xmlNewDocComment(*(xmlDocPtr *)((long)ctx + 0x10),value);
  if (node != (xmlNodePtr)0x0) {
    xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,node);
    return;
  }
  xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  return;
}

Assistant:

void
xmlSAX2Comment(void *ctx, const xmlChar *value)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;

    if (ctx == NULL) return;

    ret = xmlNewDocComment(ctxt->myDoc, value);
    if (ret == NULL) {
        xmlSAX2ErrMemory(ctxt);
        return;
    }

    xmlSAX2AppendChild(ctxt, ret);
}